

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O2

void wallscan_np2_ds(drawseg_t *ds,int x1,int x2,short *uwal,short *dwal,float *swal,fixed_t *lwal,
                    double yrepeat)

{
  double dVar1;
  double bot;
  double top;
  double dVar2;
  
  if (1 << (rw_pic->HeightBits & 0x1f) == (uint)rw_pic->Height) {
    call_wallscan(x1,x2,uwal,dwal,swal,lwal,yrepeat,true);
  }
  else {
    dVar1 = secplane_t::ZatPoint(&ds->curline->frontsector->ceilingplane,ds->curline->v1);
    bot = secplane_t::ZatPoint(&ds->curline->frontsector->floorplane,ds->curline->v1);
    top = secplane_t::ZatPoint(&ds->curline->frontsector->ceilingplane,ds->curline->v2);
    dVar2 = secplane_t::ZatPoint(&ds->curline->frontsector->floorplane,ds->curline->v2);
    if (top <= dVar1) {
      top = dVar1;
    }
    if (((fake3D & 2U) != 0) && (sclipTop <= top)) {
      top = sclipTop;
    }
    if (dVar2 <= bot) {
      bot = dVar2;
    }
    if (((fake3D & 1U) != 0) && (bot <= sclipBottom)) {
      bot = sclipBottom;
    }
    wallscan_np2(x1,x2,uwal,dwal,swal,lwal,yrepeat,top,bot,true);
  }
  return;
}

Assistant:

static void wallscan_np2_ds(drawseg_t *ds, int x1, int x2, short *uwal, short *dwal, float *swal, fixed_t *lwal, double yrepeat)
{
	if (rw_pic->GetHeight() != 1 << rw_pic->HeightBits)
	{
		double frontcz1 = ds->curline->frontsector->ceilingplane.ZatPoint(ds->curline->v1);
		double frontfz1 = ds->curline->frontsector->floorplane.ZatPoint(ds->curline->v1);
		double frontcz2 = ds->curline->frontsector->ceilingplane.ZatPoint(ds->curline->v2);
		double frontfz2 = ds->curline->frontsector->floorplane.ZatPoint(ds->curline->v2);
		double top = MAX(frontcz1, frontcz2);
		double bot = MIN(frontfz1, frontfz2);
		if (fake3D & FAKE3D_CLIPTOP)
		{
			top = MIN(top, sclipTop);
		}
		if (fake3D & FAKE3D_CLIPBOTTOM)
		{
			bot = MAX(bot, sclipBottom);
		}
		wallscan_np2(x1, x2, uwal, dwal, swal, lwal, yrepeat, top, bot, true);
	}
	else
	{
		call_wallscan(x1, x2, uwal, dwal, swal, lwal, yrepeat, true);
	}
}